

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatterTest_Examples_Test::TestBody(FormatterTest_Examples_Test *this)

{
  bool bVar1;
  AssertionResult *pAVar2;
  string gtest_output;
  OutputRedirect gtest_redir;
  string gtest_expected_output;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  format_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  char buffer [256];
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff640;
  char (*in_stack_fffffffffffff648) [256];
  OutputRedirect *in_stack_fffffffffffff650;
  char *in_stack_fffffffffffff658;
  int line;
  AssertionResult *in_stack_fffffffffffff660;
  undefined4 in_stack_fffffffffffff668;
  Type in_stack_fffffffffffff66c;
  OutputRedirect *in_stack_fffffffffffff670;
  wchar_t (*in_stack_fffffffffffff678) [19];
  char (*in_stack_fffffffffffff688) [4];
  undefined7 in_stack_fffffffffffff690;
  undefined1 in_stack_fffffffffffff697;
  char (*in_stack_fffffffffffff698) [14];
  char *in_stack_fffffffffffff6a0;
  char (*in_stack_fffffffffffff6a8) [14];
  Message *in_stack_fffffffffffff6b8;
  AssertHelper *in_stack_fffffffffffff6c0;
  string local_748 [32];
  double local_728;
  undefined1 local_709 [33];
  AssertionResult local_6e8 [2];
  undefined4 local_6c4;
  wstring local_6c0 [32];
  AssertionResult local_6a0 [3];
  int local_66c;
  string local_668 [38];
  byte local_642;
  allocator local_641;
  string local_640 [32];
  AssertionResult local_620 [2];
  undefined4 local_5fc;
  string local_5f8 [32];
  AssertionResult local_5d8 [2];
  undefined4 local_5b4;
  string local_5b0 [32];
  AssertionResult local_590 [2];
  undefined4 local_56c;
  string local_568 [32];
  AssertionResult local_548 [2];
  undefined8 local_528;
  undefined8 local_520;
  string local_518 [32];
  AssertionResult local_4f8 [2];
  undefined8 local_4d8;
  undefined8 local_4d0;
  string local_4c8 [32];
  AssertionResult local_4a8 [2];
  undefined8 local_488;
  undefined8 local_480;
  string local_478 [32];
  AssertionResult local_458 [2];
  string local_438 [32];
  AssertionResult local_418 [2];
  string local_3f8 [32];
  AssertionResult local_3d8 [2];
  string local_3b8 [32];
  AssertionResult local_398 [2];
  string local_378 [32];
  AssertionResult local_358 [2];
  string local_338 [32];
  AssertionResult local_318 [2];
  undefined1 local_2f3;
  undefined1 local_2f2;
  undefined1 local_2f1;
  string local_2f0 [32];
  AssertionResult local_2d0 [2];
  undefined1 local_2ab;
  undefined1 local_2aa;
  undefined1 local_2a9;
  string local_2a8 [32];
  AssertionResult local_288 [2];
  undefined1 local_263;
  undefined1 local_262;
  undefined1 local_261;
  string local_260 [32];
  AssertionResult local_240 [2];
  undefined8 local_220;
  string local_218 [32];
  AssertionResult local_1f8;
  char local_1e8 [280];
  undefined4 local_d0;
  undefined4 local_cc;
  string local_c8 [32];
  AssertionResult local_a8 [2];
  string local_88 [32];
  AssertionResult local_68 [3];
  string local_38 [32];
  AssertionResult local_18;
  
  fmt::v5::format<char[31],char[6]>
            ((char (*) [31])in_stack_fffffffffffff678,(char (*) [6])in_stack_fffffffffffff670);
  testing::internal::EqHelper<false>::Compare<char[33],std::__cxx11::string>
            (in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,
             (char (*) [33])in_stack_fffffffffffff648,in_stack_fffffffffffff640);
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x1755ee);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
               (char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x175651);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1756a9);
  fmt::v5::format<char[14],char[10]>
            ((char (*) [14])in_stack_fffffffffffff678,(char (*) [10])in_stack_fffffffffffff670);
  testing::internal::EqHelper<false>::Compare<char[21],std::__cxx11::string>
            (in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,
             (char (*) [21])in_stack_fffffffffffff648,in_stack_fffffffffffff640);
  std::__cxx11::string::~string(local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x17579a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
               (char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x1757fd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x175855);
  local_cc = 1;
  local_d0 = 3;
  fmt::v5::format<char[14],int,int>
            (in_stack_fffffffffffff698,
             (int *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
             (int *)in_stack_fffffffffffff688);
  testing::internal::EqHelper<false>::Compare<char[12],std::__cxx11::string>
            (in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,
             (char (*) [12])in_stack_fffffffffffff648,in_stack_fffffffffffff640);
  std::__cxx11::string::~string(local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x175965);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
               (char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x1759c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x175a20);
  safe_sprintf<256ul>((char (*) [256])0xbff3333333333333,local_1e8,"%03.2f");
  local_220 = 0xbff3333333333333;
  fmt::v5::format<char[9],double>
            ((char (*) [9])in_stack_fffffffffffff678,(double *)in_stack_fffffffffffff670);
  testing::internal::EqHelper<false>::Compare<char[256],std::__cxx11::string>
            (in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,in_stack_fffffffffffff648,
             in_stack_fffffffffffff640);
  std::__cxx11::string::~string(local_218);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x175b4b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
               (char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x175bae);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x175c06);
  local_261 = 0x61;
  local_262 = 0x62;
  local_263 = 99;
  fmt::v5::format<char[14],char,char,char>
            (in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,*in_stack_fffffffffffff698,
             (char *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690));
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            (in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,
             (char (*) [8])in_stack_fffffffffffff648,in_stack_fffffffffffff640);
  std::__cxx11::string::~string(local_260);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_240);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x175d20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
               (char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x175d83);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x175ddb);
  local_2a9 = 0x61;
  local_2aa = 0x62;
  local_2ab = 99;
  fmt::v5::format<char[11],char,char,char>
            ((char (*) [11])in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
             *in_stack_fffffffffffff698,
             (char *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690));
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            (in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,
             (char (*) [8])in_stack_fffffffffffff648,in_stack_fffffffffffff640);
  std::__cxx11::string::~string(local_2a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_288);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x175ef5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
               (char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x175f58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x175fb0);
  local_2f1 = 0x61;
  local_2f2 = 0x62;
  local_2f3 = 99;
  fmt::v5::format<char[14],char,char,char>
            (in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,*in_stack_fffffffffffff698,
             (char *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690));
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            (in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,
             (char (*) [8])in_stack_fffffffffffff648,in_stack_fffffffffffff640);
  std::__cxx11::string::~string(local_2f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x1760ca);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
               (char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x17612d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x176185);
  fmt::v5::format<char[10],char[5],char[4]>
            ((char (*) [10])in_stack_fffffffffffff698,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
             in_stack_fffffffffffff688);
  testing::internal::EqHelper<false>::Compare<char[12],std::__cxx11::string>
            (in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,
             (char (*) [12])in_stack_fffffffffffff648,in_stack_fffffffffffff640);
  std::__cxx11::string::~string(local_338);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_318);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x17627d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
               (char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x1762e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x176338);
  fmt::v5::format<char[7],char[13]>
            ((char (*) [7])in_stack_fffffffffffff678,(char (*) [13])in_stack_fffffffffffff670);
  testing::internal::EqHelper<false>::Compare<char[31],std::__cxx11::string>
            (in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,
             (char (*) [31])in_stack_fffffffffffff648,in_stack_fffffffffffff640);
  std::__cxx11::string::~string(local_378);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_358);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x176429);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
               (char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x17648c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1764e4);
  fmt::v5::format<char[7],char[14]>
            ((char (*) [7])in_stack_fffffffffffff678,(char (*) [14])in_stack_fffffffffffff670);
  testing::internal::EqHelper<false>::Compare<char[31],std::__cxx11::string>
            (in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,
             (char (*) [31])in_stack_fffffffffffff648,in_stack_fffffffffffff640);
  std::__cxx11::string::~string(local_3b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_398);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x1765d5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
               (char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x176638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x176690);
  fmt::v5::format<char[7],char[9]>
            ((char (*) [7])in_stack_fffffffffffff678,(char (*) [9])in_stack_fffffffffffff670);
  testing::internal::EqHelper<false>::Compare<char[31],std::__cxx11::string>
            (in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,
             (char (*) [31])in_stack_fffffffffffff648,in_stack_fffffffffffff640);
  std::__cxx11::string::~string(local_3f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x176781);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
               (char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x1767e4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17683c);
  fmt::v5::format<char[8],char[9]>
            ((char (*) [8])in_stack_fffffffffffff678,(char (*) [9])in_stack_fffffffffffff670);
  testing::internal::EqHelper<false>::Compare<char[31],std::__cxx11::string>
            (in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,
             (char (*) [31])in_stack_fffffffffffff648,in_stack_fffffffffffff640);
  std::__cxx11::string::~string(local_438);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_418);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x17692d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
               (char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x176990);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1769e8);
  local_480 = 0x40091eb851eb851f;
  local_488 = 0xc0091eb851eb851f;
  fmt::v5::format<char[13],double,double>
            ((char (*) [13])in_stack_fffffffffffff698,
             (double *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
             (double *)in_stack_fffffffffffff688);
  testing::internal::EqHelper<false>::Compare<char[21],std::__cxx11::string>
            (in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,
             (char (*) [21])in_stack_fffffffffffff648,in_stack_fffffffffffff640);
  std::__cxx11::string::~string(local_478);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_458);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x176b06);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
               (char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x176b69);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x176bc1);
  local_4d0 = 0x40091eb851eb851f;
  local_4d8 = 0xc0091eb851eb851f;
  fmt::v5::format<char[13],double,double>
            ((char (*) [13])in_stack_fffffffffffff698,
             (double *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
             (double *)in_stack_fffffffffffff688);
  testing::internal::EqHelper<false>::Compare<char[21],std::__cxx11::string>
            (in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,
             (char (*) [21])in_stack_fffffffffffff648,in_stack_fffffffffffff640);
  std::__cxx11::string::~string(local_4c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x176cdf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
               (char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x176d42);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x176d9a);
  local_520 = 0x40091eb851eb851f;
  local_528 = 0xc0091eb851eb851f;
  fmt::v5::format<char[13],double,double>
            ((char (*) [13])in_stack_fffffffffffff698,
             (double *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
             (double *)in_stack_fffffffffffff688);
  testing::internal::EqHelper<false>::Compare<char[20],std::__cxx11::string>
            (in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,
             (char (*) [20])in_stack_fffffffffffff648,in_stack_fffffffffffff640);
  std::__cxx11::string::~string(local_518);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x176eb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
               (char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x176f1b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x176f73);
  local_56c = 0x2a;
  fmt::v5::format<char[37],int>
            ((char (*) [37])in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
  testing::internal::EqHelper<false>::Compare<char[28],std::__cxx11::string>
            (in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,
             (char (*) [28])in_stack_fffffffffffff648,in_stack_fffffffffffff640);
  std::__cxx11::string::~string(local_568);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_548);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x177070);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
               (char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x1770d3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17712b);
  local_5b4 = 0x2a;
  fmt::v5::format<char[39],int>
            ((char (*) [39])in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
  testing::internal::EqHelper<false>::Compare<char[31],std::__cxx11::string>
            (in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,
             (char (*) [31])in_stack_fffffffffffff648,in_stack_fffffffffffff640);
  std::__cxx11::string::~string(local_5b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_590);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x177228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
               (char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x17728b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1772e3);
  local_5fc = 0x2a;
  fmt::v5::format<char[17],int>
            ((char (*) [17])in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
  testing::internal::EqHelper<false>::Compare<char[17],std::__cxx11::string>
            (in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,
             (char (*) [17])in_stack_fffffffffffff648,in_stack_fffffffffffff640);
  std::__cxx11::string::~string(local_5f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x1773e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
               (char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x177443);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17749b);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_620);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_640,"invalid type specifier",&local_641);
    std::allocator<char>::~allocator((allocator<char> *)&local_641);
    local_642 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[19],char[10]>
                ((char (*) [19])in_stack_fffffffffffff678,(char (*) [10])in_stack_fffffffffffff670);
      std::__cxx11::string::~string(local_668);
    }
    if ((local_642 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffff670,
                 (char (*) [123])CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
      local_66c = 2;
    }
    else {
      local_66c = 0;
    }
    std::__cxx11::string::~string(local_640);
    if (local_66c != 0) goto LAB_00177829;
  }
  else {
LAB_00177829:
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x177845);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,(int)((ulong)in_stack_fffffffffffff658 >> 0x20),
               (char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x1778a2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1778fa);
  local_6c4 = 0x42e;
  fmt::v5::format<wchar_t[19],wchar_t>
            (in_stack_fffffffffffff678,(wchar_t *)in_stack_fffffffffffff670);
  testing::internal::EqHelper<false>::Compare<wchar_t[18],std::__cxx11::wstring>
            (in_stack_fffffffffffff658,(char *)in_stack_fffffffffffff650,
             (wchar_t (*) [18])in_stack_fffffffffffff648,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffff640);
  line = (int)((ulong)in_stack_fffffffffffff658 >> 0x20);
  std::__cxx11::wstring::~wstring(local_6c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff670);
    testing::AssertionResult::failure_message((AssertionResult *)0x1779eb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
               &in_stack_fffffffffffff660->success_,line,(char *)in_stack_fffffffffffff650);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
    testing::Message::~Message((Message *)0x177a48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x177aa0);
  pAVar2 = local_6e8;
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar2);
  if (bVar1) {
    in_stack_fffffffffffff670 = (OutputRedirect *)local_709;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_709 + 1),"inf",(allocator *)in_stack_fffffffffffff670);
    std::allocator<char>::~allocator((allocator<char> *)local_709);
    OutputRedirect::OutputRedirect
              (in_stack_fffffffffffff670,
               (FILE *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_fffffffffffff66c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff66c);
    if (bVar1) {
      local_728 = std::numeric_limits<double>::infinity();
      fmt::v5::print<char[3],double>
                ((char (*) [3])in_stack_fffffffffffff670,
                 (double *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
    }
    OutputRedirect::restore_and_read_abi_cxx11_((OutputRedirect *)gtest_ar_8.message_.ptr_);
    bVar1 = std::operator!=(in_stack_fffffffffffff640,in_stack_fffffffffffff638);
    if (bVar1) {
      in_stack_fffffffffffff660 =
           testing::AssertionResult::operator<<
                     ((AssertionResult *)in_stack_fffffffffffff670,
                      (char (*) [86])CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
      pAVar2 = testing::AssertionResult::operator<<
                         ((AssertionResult *)in_stack_fffffffffffff670,
                          (char (*) [11])
                          CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
      line = (int)((ulong)pAVar2 >> 0x20);
      in_stack_fffffffffffff650 =
           (OutputRedirect *)
           testing::AssertionResult::operator<<
                     ((AssertionResult *)in_stack_fffffffffffff670,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffff670,
                 (char (*) [2])CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
      in_stack_fffffffffffff640 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           testing::AssertionResult::operator<<
                     ((AssertionResult *)in_stack_fffffffffffff670,
                      (char (*) [11])CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffff670,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
      local_66c = 3;
    }
    else {
      local_66c = 0;
    }
    std::__cxx11::string::~string(local_748);
    OutputRedirect::~OutputRedirect(in_stack_fffffffffffff650);
    std::__cxx11::string::~string((string *)(local_709 + 1));
    if (local_66c == 0) goto LAB_00177e01;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffff670);
  testing::AssertionResult::failure_message((AssertionResult *)0x177d5e);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c,
             &in_stack_fffffffffffff660->success_,line,(char *)in_stack_fffffffffffff650);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff640);
  testing::Message::~Message((Message *)0x177db9);
LAB_00177e01:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x177e0e);
  return;
}

Assistant:

TEST(FormatterTest, Examples) {
  EXPECT_EQ("First, thou shalt count to three",
      format("First, thou shalt count to {0}", "three"));
  EXPECT_EQ("Bring me a shrubbery",
      format("Bring me a {}", "shrubbery"));
  EXPECT_EQ("From 1 to 3", format("From {} to {}", 1, 3));

  char buffer[BUFFER_SIZE];
  safe_sprintf(buffer, "%03.2f", -1.2);
  EXPECT_EQ(buffer, format("{:03.2f}", -1.2));

  EXPECT_EQ("a, b, c", format("{0}, {1}, {2}", 'a', 'b', 'c'));
  EXPECT_EQ("a, b, c", format("{}, {}, {}", 'a', 'b', 'c'));
  EXPECT_EQ("c, b, a", format("{2}, {1}, {0}", 'a', 'b', 'c'));
  EXPECT_EQ("abracadabra", format("{0}{1}{0}", "abra", "cad"));

  EXPECT_EQ("left aligned                  ",
      format("{:<30}", "left aligned"));
  EXPECT_EQ("                 right aligned",
      format("{:>30}", "right aligned"));
  EXPECT_EQ("           centered           ",
      format("{:^30}", "centered"));
  EXPECT_EQ("***********centered***********",
      format("{:*^30}", "centered"));

  EXPECT_EQ("+3.140000; -3.140000",
      format("{:+f}; {:+f}", 3.14, -3.14));
  EXPECT_EQ(" 3.140000; -3.140000",
      format("{: f}; {: f}", 3.14, -3.14));
  EXPECT_EQ("3.140000; -3.140000",
      format("{:-f}; {:-f}", 3.14, -3.14));

  EXPECT_EQ("int: 42;  hex: 2a;  oct: 52",
      format("int: {0:d};  hex: {0:x};  oct: {0:o}", 42));
  EXPECT_EQ("int: 42;  hex: 0x2a;  oct: 052",
      format("int: {0:d};  hex: {0:#x};  oct: {0:#o}", 42));

  EXPECT_EQ("The answer is 42", format("The answer is {}", 42));
  EXPECT_THROW_MSG(
    format("The answer is {:d}", "forty-two"), format_error,
    "invalid type specifier");

  EXPECT_EQ(L"Cyrillic letter \x42e",
    format(L"Cyrillic letter {}", L'\x42e'));

  EXPECT_WRITE(stdout,
      fmt::print("{}", std::numeric_limits<double>::infinity()), "inf");
}